

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * __thiscall CodeGen::generateEnumType_abi_cxx11_(CodeGen *this,NodePtr *n)

{
  int iVar1;
  int iVar2;
  type pNVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_ptr<avro::Node> *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t i;
  size_t c;
  string *s;
  Name *in_stack_ffffffffffffff88;
  ulong local_40;
  
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  (*pNVar3->_vptr_Node[3])();
  decorate_abi_cxx11_(in_stack_ffffffffffffff88);
  poVar4 = std::operator<<(*(ostream **)(in_RSI + 8),"enum ");
  poVar4 = std::operator<<(poVar4,(string *)in_RDI);
  std::operator<<(poVar4," {\n");
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  iVar1 = (*pNVar3->_vptr_Node[7])();
  for (local_40 = 0; local_40 < CONCAT44(extraout_var,iVar1); local_40 = local_40 + 1) {
    poVar4 = std::operator<<(*(ostream **)(in_RSI + 8),"    ");
    pNVar3 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
    iVar2 = (*pNVar3->_vptr_Node[8])(pNVar3,local_40 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar4,",\n");
  }
  std::operator<<(*(ostream **)(in_RSI + 8),"};\n\n");
  return in_RDI;
}

Assistant:

string CodeGen::generateEnumType(const NodePtr& n)
{
    string s = decorate(n->name());
    os_ << "enum " << s << " {\n";
    size_t c = n->names();
    for (size_t i = 0; i < c; ++i) {
        os_ << "    " << n->nameAt(i) << ",\n";
    }
    os_ << "};\n\n";
    return s;
}